

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpComms.cpp
# Opt level: O0

void __thiscall helics::udp::UdpComms::loadNetworkInfo(UdpComms *this,NetworkBrokerData *netInfo)

{
  bool bVar1;
  CommsInterface *in_RDI;
  NetworkBrokerData *in_stack_00000028;
  NetworkCommsInterface *in_stack_00000030;
  promise<int> *in_stack_ffffffffffffffb8;
  CommsInterface *in_stack_ffffffffffffffc8;
  promise<int> *in_stack_ffffffffffffffd0;
  promise<int> *in_stack_ffffffffffffffd8;
  promise<int> *in_stack_ffffffffffffffe0;
  
  NetworkCommsInterface::loadNetworkInfo(in_stack_00000030,in_stack_00000028);
  bVar1 = CommsInterface::propertyLock(in_stack_ffffffffffffffc8);
  if (bVar1) {
    std::promise<int>::promise(in_stack_ffffffffffffffe0);
    std::promise<int>::operator=(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    std::promise<int>::~promise(in_stack_ffffffffffffffd0);
    std::promise<int>::get_future(in_stack_ffffffffffffffb8);
    std::future<int>::operator=
              ((future<int> *)in_stack_ffffffffffffffd0,(future<int> *)in_stack_ffffffffffffffc8);
    std::future<int>::~future((future<int> *)0x39f792);
    CommsInterface::propertyUnLock(in_RDI);
  }
  return;
}

Assistant:

void UdpComms::loadNetworkInfo(const NetworkBrokerData& netInfo)
{
    NetworkCommsInterface::loadNetworkInfo(netInfo);
    if (!propertyLock()) {
        return;
    }

    promisePort = std::promise<int>();
    futurePort = promisePort.get_future();

    propertyUnLock();
}